

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

void __thiscall
UnicodeFullTest_equalsi_Test<std::pair<char16_t,_char>_>::TestBody
          (UnicodeFullTest_equalsi_Test<std::pair<char16_t,_char>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar2;
  char32_t (*in_RDX) [5];
  char32_t (*in_string) [5];
  char32_t (*extraout_RDX_00) [5];
  char32_t (*extraout_RDX_01) [5];
  char32_t (*extraout_RDX_02) [5];
  char32_t (*extraout_RDX_03) [5];
  char32_t (*extraout_RDX_04) [5];
  char32_t (*extraout_RDX_05) [5];
  char32_t (*in_string_00) [5];
  char32_t (*extraout_RDX_07) [5];
  char32_t (*extraout_RDX_08) [5];
  char32_t (*extraout_RDX_09) [5];
  char32_t (*extraout_RDX_10) [5];
  char32_t (*extraout_RDX_11) [5];
  char32_t (*extraout_RDX_12) [5];
  char32_t (*in_string_01) [5];
  char32_t (*extraout_RDX_14) [5];
  char32_t (*extraout_RDX_15) [5];
  char32_t (*extraout_RDX_16) [5];
  char32_t (*extraout_RDX_17) [5];
  char32_t (*extraout_RDX_18) [5];
  char32_t (*extraout_RDX_19) [5];
  char32_t (*in_string_02) [5];
  char32_t (*extraout_RDX_21) [5];
  char32_t (*extraout_RDX_22) [5];
  char32_t (*extraout_RDX_23) [5];
  char32_t (*extraout_RDX_24) [5];
  char32_t (*extraout_RDX_25) [5];
  char32_t (*pacVar3) [5];
  char32_t (*extraout_RDX_26) [5];
  char32_t (*in_string_03) [5];
  pointer *__ptr;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs_02;
  basic_string_view<char,_std::char_traits<char>_> rhs_03;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs_01;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs_02;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs_03;
  AssertionResult gtest_ar_;
  AssertHelper aAStack_78 [8];
  char local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char32_t (*extraout_RDX) [5];
  char32_t (*extraout_RDX_06) [5];
  char32_t (*extraout_RDX_13) [5];
  char32_t (*extraout_RDX_20) [5];
  
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"ABCD",in_RDX);
  jessilib::string_cast<char,char32_t[5]>(&local_40,(jessilib *)L"ABCD",in_string);
  rhs._M_str = local_40._M_dataplus._M_p;
  rhs._M_len = local_40._M_string_length;
  lhs._M_str = local_60._M_dataplus._M_p;
  lhs._M_len = local_60._M_string_length;
  local_70[0] = jessilib::equalsi<char16_t,char>(lhs,rhs);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  paVar1 = &local_40.field_2;
  pacVar3 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    pacVar3 = extraout_RDX_00;
  }
  paVar2 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity * 2 + 2);
    pacVar3 = extraout_RDX_01;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "equalsi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xc0,(char *)local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar3 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar3 = extraout_RDX_03;
    }
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar3 = extraout_RDX_04;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar3 = extraout_RDX_05;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"abcd",pacVar3);
  jessilib::string_cast<char,char32_t[5]>(&local_40,(jessilib *)L"abcd",in_string_00);
  rhs_00._M_str = local_40._M_dataplus._M_p;
  rhs_00._M_len = local_40._M_string_length;
  lhs_00._M_str = local_60._M_dataplus._M_p;
  lhs_00._M_len = local_60._M_string_length;
  local_70[0] = jessilib::equalsi<char16_t,char>(lhs_00,rhs_00);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar3 = extraout_RDX_06;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    pacVar3 = extraout_RDX_07;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity * 2 + 2);
    pacVar3 = extraout_RDX_08;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "equalsi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xc2,(char *)local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar3 = extraout_RDX_09;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar3 = extraout_RDX_10;
    }
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar3 = extraout_RDX_11;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar3 = extraout_RDX_12;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"ABCD",pacVar3);
  jessilib::string_cast<char,char32_t[5]>(&local_40,(jessilib *)L"abcd",in_string_01);
  rhs_01._M_str = local_40._M_dataplus._M_p;
  rhs_01._M_len = local_40._M_string_length;
  lhs_01._M_str = local_60._M_dataplus._M_p;
  lhs_01._M_len = local_60._M_string_length;
  local_70[0] = jessilib::equalsi<char16_t,char>(lhs_01,rhs_01);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar3 = extraout_RDX_13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    pacVar3 = extraout_RDX_14;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity * 2 + 2);
    pacVar3 = extraout_RDX_15;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "equalsi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xc4,(char *)local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar3 = extraout_RDX_16;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar3 = extraout_RDX_17;
    }
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar3 = extraout_RDX_18;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar3 = extraout_RDX_19;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"abcd",pacVar3);
  jessilib::string_cast<char,char32_t[5]>(&local_40,(jessilib *)L"ABCD",in_string_02);
  rhs_02._M_str = local_40._M_dataplus._M_p;
  rhs_02._M_len = local_40._M_string_length;
  lhs_02._M_str = local_60._M_dataplus._M_p;
  lhs_02._M_len = local_60._M_string_length;
  local_70[0] = jessilib::equalsi<char16_t,char>(lhs_02,rhs_02);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar3 = extraout_RDX_20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    pacVar3 = extraout_RDX_21;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity * 2 + 2);
    pacVar3 = extraout_RDX_22;
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "equalsi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xc6,(char *)local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    pacVar3 = extraout_RDX_23;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      pacVar3 = extraout_RDX_24;
    }
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      pacVar3 = extraout_RDX_25;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
    pacVar3 = extraout_RDX_26;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"ABcd",pacVar3);
  jessilib::string_cast<char,char32_t[5]>(&local_40,(jessilib *)L"abCD",in_string_03);
  rhs_03._M_str = local_40._M_dataplus._M_p;
  rhs_03._M_len = local_40._M_string_length;
  lhs_03._M_str = local_60._M_dataplus._M_p;
  lhs_03._M_len = local_60._M_string_length;
  local_70[0] = jessilib::equalsi<char16_t,char>(lhs_03,rhs_03);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_70[0] == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,local_70,
               "equalsi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,200,(char *)local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_78,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(aAStack_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, equalsi) {
	// TypeParam::first_type == TypeParam::second_type
	EXPECT_TRUE(equalsi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(equalsi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(equalsi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(equalsi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(equalsi(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));
}